

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptUtils.cpp
# Opt level: O0

Object * getPureObject(Object *object)

{
  int iVar1;
  runtime_error *this;
  long local_48;
  Variable *objectVariable;
  ObjectType type;
  Object *object_local;
  
  if (object != (Object *)0x0) {
    iVar1 = (**object->_vptr_Object)();
    object_local = object;
    if ((char)iVar1 == '\x02') {
      if (object == (Object *)0x0) {
        local_48 = 0;
      }
      else {
        local_48 = __dynamic_cast(object,&Object::typeinfo,&Variable::typeinfo,0);
      }
      object_local = *(Object **)(local_48 + 8);
    }
    return object_local;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"ScriptUtils::getPureObject => object is null!");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Object* getPureObject(Object* object) {
	if (object == nullptr) {
		throw std::runtime_error("ScriptUtils::getPureObject => object is null!");
	}
	ObjectType type = object->getType();
	if (type == OT_VARIABLE) {
		auto *objectVariable = dynamic_cast<Variable *>(object);
		return objectVariable->value;
	} else {
		return object;
	}
}